

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollArea::addScrollBarWidget
          (QAbstractScrollArea *this,QWidget *widget,Alignment alignment)

{
  bool bVar1;
  Int IVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QAbstractScrollAreaPrivate *pQVar5;
  QWidget *in_RSI;
  QAbstractScrollAreaScrollBarContainer *in_RDI;
  long in_FS_OFFSET;
  LogicalPosition position;
  Orientation scrollBarOrientation;
  QAbstractScrollAreaPrivate *d;
  Orientation in_stack_ffffffffffffffac;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar7;
  LogicalPosition position_00;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_1c;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_18;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_14;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QAbstractScrollArea *)0x497d83);
  position_00 = (LogicalPosition)((ulong)pQVar5 >> 0x20);
  if (in_RSI != (QWidget *)0x0) {
    local_10.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)
                    CONCAT17(in_stack_ffffffffffffffb7,
                             CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                    in_stack_ffffffffffffffac);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
    uVar7 = true;
    if (IVar2 == 0) {
      local_14.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)
                      CONCAT17(1,CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                      in_stack_ffffffffffffffac);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
      uVar7 = IVar2 != 0;
    }
    uVar3 = 2;
    if ((bool)uVar7 != false) {
      uVar3 = 1;
    }
    local_18.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)
                    CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                    in_stack_ffffffffffffffac);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
    uVar6 = true;
    if (IVar2 == 0) {
      local_1c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)
                      CONCAT17(uVar7,CONCAT16(1,in_stack_ffffffffffffffb0)),
                      in_stack_ffffffffffffffac);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
      uVar6 = IVar2 != 0;
    }
    uVar4 = 1;
    if ((bool)uVar6 != false) {
      uVar4 = 2;
    }
    QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
              ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)
               CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffb0)),in_stack_ffffffffffffffac);
    QAbstractScrollAreaScrollBarContainer::addWidget(in_RDI,in_RSI,position_00);
    QAbstractScrollAreaPrivate::layoutChildren
              ((QAbstractScrollAreaPrivate *)
               CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffb0)));
    bVar1 = QWidget::isHidden((QWidget *)0x497ea1);
    if (!bVar1) {
      QWidget::show((QWidget *)CONCAT44(uVar3,uVar4));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractScrollArea::addScrollBarWidget(QWidget *widget, Qt::Alignment alignment)
{
    Q_D(QAbstractScrollArea);

    if (widget == nullptr)
        return;

    const Qt::Orientation scrollBarOrientation
        = ((alignment & Qt::AlignLeft) || (alignment & Qt::AlignRight)) ? Qt::Horizontal : Qt::Vertical;
    const QAbstractScrollAreaScrollBarContainer::LogicalPosition position
        = ((alignment & Qt::AlignRight) || (alignment & Qt::AlignBottom))
          ? QAbstractScrollAreaScrollBarContainer::LogicalRight : QAbstractScrollAreaScrollBarContainer::LogicalLeft;
    d->scrollBarContainers[scrollBarOrientation]->addWidget(widget, position);
    d->layoutChildren();
    if (isHidden() == false)
        widget->show();
}